

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(void)

{
  int i;
  long lVar1;
  char buffer [32];
  undefined1 auStack_38 [32];
  
  lVar1 = 0;
  do {
    printf("%c ",(ulong)(uint)(int)"Hello World!\n"[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xd);
  puts("Hello World!\n");
  printf("Enter a string: ");
  __isoc99_scanf("%[^\n]",auStack_38);
  printf("You entered: %s\n",auStack_38);
  puts("Hello Again");
  return 0;
}

Assistant:

int main() {

    char string[] = "Hello World!\n";

    for (int i = 0; i < strlen(string); i++) {
        printf("%c ", string[i]);
    }

    printf("%s\n", string);

    char buffer[32];

    printf("Enter a string: ");
    scanf("%[^\n]", buffer);

    printf("You entered: %s\n", buffer);

    char ch_str[] = {'H','e','l','l','o',0x20,'A','g','a','i','n','\0'};

    printf("%s\n", ch_str);

    return 0;
}